

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O0

GLenum polyscope::render::backend_openGL3_glfw::internalFormat(TextureFormat *x)

{
  runtime_error *this;
  undefined4 *in_RDI;
  GLenum local_4;
  
  switch(*in_RDI) {
  case 0:
    local_4 = 0x8051;
    break;
  case 1:
    local_4 = 0x8058;
    break;
  case 2:
    local_4 = 0x822f;
    break;
  case 3:
    local_4 = 0x881b;
    break;
  case 4:
    local_4 = 0x881a;
    break;
  case 5:
    local_4 = 0x8814;
    break;
  case 6:
    local_4 = 0x8814;
    break;
  case 7:
    local_4 = 0x822e;
    break;
  case 8:
    local_4 = 0x822d;
    break;
  case 9:
    local_4 = 0x81a6;
    break;
  default:
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"bad enum");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return local_4;
}

Assistant:

inline GLenum internalFormat(const TextureFormat& x) {
  switch (x) {
    case TextureFormat::RGB8:       return GL_RGB8;
    case TextureFormat::RGBA8:      return GL_RGBA8;
    case TextureFormat::RG16F:      return GL_RG16F;
    case TextureFormat::RGB16F:     return GL_RGB16F;
    case TextureFormat::RGBA16F:    return GL_RGBA16F;
    case TextureFormat::R32F:       return GL_R32F;
    case TextureFormat::R16F:       return GL_R16F;
    case TextureFormat::RGB32F:     return GL_RGBA32F;
    case TextureFormat::RGBA32F:    return GL_RGBA32F;
    case TextureFormat::DEPTH24:    return GL_DEPTH_COMPONENT24;
  }
  throw std::runtime_error("bad enum");
}